

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_add(roaring_bitmap_t *r,uint32_t val)

{
  uint8_t typecode;
  ushort uVar1;
  int iVar2;
  uint16_t *puVar3;
  uint8_t *puVar4;
  undefined8 in_RAX;
  shared_container_t *sc;
  container_t *pcVar5;
  void *c;
  container_t *pcVar6;
  void **ppvVar7;
  int iVar8;
  ushort key;
  uint uVar9;
  uint uVar10;
  uint8_t newtypecode;
  undefined8 uStack_38;
  
  iVar2 = (r->high_low_container).size;
  key = (ushort)(val >> 0x10);
  uStack_38 = in_RAX;
  if (((long)iVar2 == 0) || (puVar3 = (r->high_low_container).keys, puVar3[(long)iVar2 + -1] == key)
     ) {
    uVar9 = iVar2 - 1;
  }
  else {
    if (iVar2 < 1) {
      uVar9 = 0xffffffff;
      goto LAB_00111b03;
    }
    iVar8 = iVar2 + -1;
    uVar10 = 0;
    do {
      uVar9 = iVar8 + uVar10 >> 1;
      uVar1 = *(ushort *)((long)puVar3 + (ulong)(iVar8 + uVar10 & 0xfffffffe));
      if (uVar1 < key) {
        uVar10 = uVar9 + 1;
      }
      else {
        if (uVar1 <= key) goto LAB_00111a19;
        iVar8 = uVar9 - 1;
      }
    } while ((int)uVar10 <= iVar8);
    uVar9 = ~uVar10;
  }
  if (-1 < (int)uVar9) {
LAB_00111a19:
    uVar10 = uVar9 & 0xffff;
    if (iVar2 <= (int)uVar10) {
      __assert_fail("i < ra->size",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1a95,"void ra_unshare_container_at_index(roaring_array_t *, uint16_t)");
    }
    ppvVar7 = (r->high_low_container).containers;
    puVar4 = (r->high_low_container).typecodes;
    sc = (shared_container_t *)ppvVar7[uVar10];
    if (puVar4[uVar10] == '\x04') {
      sc = (shared_container_t *)shared_container_extract_copy(sc,puVar4 + uVar10);
      ppvVar7 = (r->high_low_container).containers;
    }
    *(shared_container_t **)((long)ppvVar7 + (ulong)(uVar10 * 8)) = sc;
    typecode = (r->high_low_container).typecodes[uVar10];
    pcVar6 = *(container_t **)((long)(r->high_low_container).containers + (ulong)(uVar10 * 8));
    uStack_38._0_7_ = CONCAT16(typecode,(undefined6)uStack_38);
    pcVar5 = container_add(pcVar6,(uint16_t)val,typecode,(uint8_t *)((long)&uStack_38 + 6));
    if (pcVar5 != pcVar6) {
      container_free(pcVar6,typecode);
      if ((r->high_low_container).size <= (int)uVar9) {
        __assert_fail("i < ra->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x1a3a,
                      "void ra_set_container_at_index(const roaring_array_t *, int32_t, container_t *, uint8_t)"
                     );
      }
      (r->high_low_container).containers[uVar9] = pcVar5;
      (r->high_low_container).typecodes[uVar9] = uStack_38._6_1_;
    }
    return;
  }
LAB_00111b03:
  c = calloc(1,0x10);
  pcVar6 = container_add(c,(uint16_t)val,'\x02',(uint8_t *)((long)&uStack_38 + 7));
  ra_insert_new_key_value_at(&r->high_low_container,~uVar9,key,pcVar6,uStack_38._7_1_);
  return;
}

Assistant:

void roaring_bitmap_add(roaring_bitmap_t *r, uint32_t val) {
    roaring_array_t *ra = &r->high_low_container;

    const uint16_t hb = val >> 16;
    const int i = ra_get_index(ra, hb);
    uint8_t typecode;
    if (i >= 0) {
        ra_unshare_container_at_index(ra, i);
        container_t *container =
            ra_get_container_at_index(ra, i, &typecode);
        uint8_t newtypecode = typecode;
        container_t *container2 =
            container_add(container, val & 0xFFFF, typecode, &newtypecode);
        if (container2 != container) {
            container_free(container, typecode);
            ra_set_container_at_index(&r->high_low_container, i, container2,
                                      newtypecode);
        }
    } else {
        array_container_t *newac = array_container_create();
        container_t *container = container_add(newac, val & 0xFFFF,
                                        ARRAY_CONTAINER_TYPE, &typecode);
        // we could just assume that it stays an array container
        ra_insert_new_key_value_at(&r->high_low_container, -i - 1, hb,
                                   container, typecode);
    }
}